

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_rowcol_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  long *plVar2;
  undefined4 *puVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  int *piVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  undefined1 auVar12 [16];
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  bool bVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  parasail_result_t *ppVar20;
  __m128i *ptr;
  int64_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  bool bVar21;
  int iVar22;
  int iVar23;
  __m128i *palVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  longlong *plVar29;
  ulong uVar30;
  longlong *plVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  longlong lVar36;
  undefined4 uVar50;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined4 uVar57;
  undefined4 uVar58;
  undefined1 in_XMM8 [16];
  __m128i_64_t B;
  undefined1 auVar59 [16];
  __m128i alVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int64_t iVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  __m128i_64_t B_1;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  __m128i_64_t e;
  __m128i_64_t h;
  ulong local_d0;
  longlong local_68;
  longlong lStack_60;
  longlong local_58;
  longlong lStack_50;
  long local_48;
  undefined8 uStack_40;
  ulong uVar51;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_rowcol_scan_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar5 = (profile->profile64).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sg_flags_rowcol_scan_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_rowcol_scan_profile_sse41_128_64_cold_6();
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_64_cold_1();
        }
        else {
          uVar18 = uVar4 - 1;
          uVar33 = (ulong)uVar4 + 1;
          uVar28 = uVar33 >> 1;
          uVar8 = (ulong)uVar18 % uVar28;
          uVar19 = (uint)(uVar18 / uVar28);
          iVar22 = -open;
          iVar25 = ppVar6->min;
          uVar30 = 0x8000000000000000 - (long)iVar25;
          if (iVar25 != iVar22 && SBORROW4(iVar25,iVar22) == iVar25 + open < 0) {
            uVar30 = (ulong)(uint)open | 0x8000000000000000;
          }
          iVar25 = ppVar6->max;
          ppVar20 = parasail_result_new_rowcol1((uint)uVar33 & 0x7ffffffe,s2Len);
          if (ppVar20 != (parasail_result_t *)0x0) {
            ppVar20->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar20->flag | 0x2840402;
            ptr = parasail_memalign___m128i(0x10,uVar28);
            ptr_00 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1U));
            ptr_01 = parasail_memalign___m128i(0x10,uVar28);
            ptr_02 = parasail_memalign___m128i(0x10,uVar28);
            ptr_03 = parasail_memalign___m128i(0x10,uVar28);
            if (ptr_03 != (__m128i *)0x0 &&
                ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                (ptr_00 != (int64_t *)0x0 && ptr != (__m128i *)0x0))) {
              iVar23 = s2Len + -1;
              local_d0 = uVar30 + 1;
              local_48 = 0x7ffffffffffffffe - (long)iVar25;
              uVar57 = (undefined4)local_d0;
              uVar58 = (undefined4)(local_d0 >> 0x20);
              uStack_40 = 0;
              uVar50 = (undefined4)((ulong)local_48 >> 0x20);
              auVar55._8_4_ = (int)local_48;
              auVar55._0_8_ = local_48;
              auVar55._12_4_ = uVar50;
              uVar34 = 0;
              do {
                lVar35 = 0;
                plVar29 = &local_68;
                plVar31 = &local_58;
                bVar16 = true;
                do {
                  bVar21 = bVar16;
                  if (s1_beg == 0) {
                    lVar35 = (long)iVar22 - (lVar35 * uVar28 + uVar34) * (ulong)(uint)gap;
                  }
                  else {
                    lVar35 = 0;
                  }
                  *plVar31 = lVar35;
                  *plVar29 = lVar35 - (ulong)(uint)open;
                  lVar35 = 1;
                  plVar29 = &lStack_60;
                  plVar31 = &lStack_50;
                  bVar16 = false;
                } while (bVar21);
                ptr_02[uVar34][0] = local_58;
                ptr_02[uVar34][1] = lStack_50;
                ptr[uVar34][0] = local_68;
                ptr[uVar34][1] = lStack_60;
                uVar34 = uVar34 + 1;
              } while (uVar34 != uVar28);
              *ptr_00 = 0;
              auVar74 = _DAT_00906ca0;
              lVar35 = (ulong)(uint)s2Len - 1;
              auVar37._8_4_ = (int)lVar35;
              auVar37._0_8_ = lVar35;
              auVar37._12_4_ = (int)((ulong)lVar35 >> 0x20);
              auVar59 = pmovsxbq(in_XMM8,0x100);
              auVar37 = auVar37 ^ _DAT_00906ca0;
              uVar34 = 0;
              do {
                if ((bool)(~(auVar37._0_8_ < (long)(uVar34 ^ auVar74._0_8_)) & 1)) {
                  iVar25 = 0;
                  if (s2_beg == 0) {
                    iVar25 = iVar22;
                  }
                  ptr_00[uVar34 + 1] = (long)iVar25;
                }
                auVar68._8_4_ = (int)uVar34;
                auVar68._0_8_ = uVar34;
                auVar68._12_4_ = (int)(uVar34 >> 0x20);
                if ((long)((auVar68._8_8_ | auVar59._8_8_) ^ auVar74._8_8_) <= auVar37._8_8_) {
                  iVar25 = iVar22 - gap;
                  if (s2_beg != 0) {
                    iVar25 = 0;
                  }
                  ptr_00[uVar34 + 2] = (long)iVar25;
                }
                uVar34 = uVar34 + 2;
                iVar22 = iVar22 + gap * -2;
              } while ((s2Len + 1U & 0xfffffffe) != uVar34);
              alVar60[1] = -(ulong)(uint)open;
              alVar60[0] = -(ulong)(uint)open;
              uVar11 = (uint)uVar28;
              palVar24 = ptr_03 + (uVar11 - 1);
              uVar34 = uVar28;
              do {
                *palVar24 = alVar60;
                lVar35 = alVar60[1];
                alVar60[0] = alVar60[0] - (ulong)(uint)gap;
                alVar60[1] = lVar35 - (ulong)(uint)gap;
                auVar74._0_8_ = -(ulong)(auVar55._0_8_ < alVar60[0]);
                auVar74._8_8_ = -(ulong)(auVar55._8_8_ < alVar60[1]);
                auVar55 = blendvpd((undefined1  [16])alVar60,auVar55,auVar74);
                palVar24 = palVar24 + -1;
                iVar25 = (int)uVar34;
                uVar26 = iVar25 - 1;
                uVar34 = (ulong)uVar26;
              } while (uVar26 != 0 && 0 < iVar25);
              palVar24 = ptr_02 + (uVar11 - 1);
              auVar59._8_4_ = uVar57;
              auVar59._0_8_ = local_d0;
              auVar59._12_4_ = uVar58;
              auVar62._8_4_ = uVar57;
              auVar62._0_8_ = local_d0;
              auVar62._12_4_ = uVar58;
              uVar34 = 0;
              iVar25 = iVar23;
              do {
                auVar65._8_4_ = (int)(*palVar24)[0];
                auVar65._0_8_ = (*palVar24)[0];
                auVar65._12_4_ = *(undefined4 *)((long)*palVar24 + 4);
                iVar22 = ppVar6->mapper[(byte)s2[uVar34]];
                auVar9._8_4_ = uVar57;
                auVar9._0_8_ = local_d0;
                auVar9._12_4_ = uVar58;
                auVar70._0_8_ = local_d0 - (*ptr_03)[0];
                auVar70._8_8_ = auVar9._8_8_ - (*ptr_03)[1];
                lVar27 = 0;
                auVar71._8_4_ = uVar57;
                auVar71._0_8_ = local_d0;
                auVar71._12_4_ = uVar58;
                iVar64 = ptr_00[uVar34];
                lVar35 = auVar65._8_8_;
                do {
                  plVar2 = (long *)((long)*ptr_02 + lVar27);
                  lVar13 = *plVar2;
                  lVar14 = plVar2[1];
                  plVar2 = (long *)((long)*ptr + lVar27);
                  auVar75._0_8_ = *plVar2 - (ulong)(uint)gap;
                  auVar75._8_8_ = plVar2[1] - (ulong)(uint)gap;
                  plVar2 = (long *)((long)pvVar5 + lVar27 + (long)iVar22 * (long)(int)uVar11 * 0x10)
                  ;
                  auVar66._0_8_ = iVar64 + *plVar2;
                  auVar66._8_8_ = lVar35 + plVar2[1];
                  plVar2 = (long *)((long)*ptr_03 + lVar27);
                  auVar69._0_8_ = auVar70._0_8_ + *plVar2;
                  auVar69._8_8_ = auVar70._8_8_ + plVar2[1];
                  auVar73._0_8_ = lVar13 - (ulong)(uint)open;
                  auVar73._8_8_ = lVar14 - (ulong)(uint)open;
                  auVar38._0_8_ = -(ulong)(auVar69._0_8_ < auVar71._0_8_);
                  auVar38._8_8_ = -(ulong)(auVar69._8_8_ < auVar71._8_8_);
                  auVar71 = blendvpd(auVar69,auVar71,auVar38);
                  auVar39._0_8_ = -(ulong)(auVar73._0_8_ < auVar75._0_8_);
                  auVar39._8_8_ = -(ulong)(auVar73._8_8_ < auVar75._8_8_);
                  auVar74 = blendvpd(auVar73,auVar75,auVar39);
                  auVar40._0_8_ = -(ulong)(auVar66._0_8_ < auVar74._0_8_);
                  auVar40._8_8_ = -(ulong)(auVar66._8_8_ < auVar74._8_8_);
                  auVar70 = blendvpd(auVar66,auVar74,auVar40);
                  *(undefined1 (*) [16])((long)*ptr + lVar27) = auVar74;
                  *(undefined1 (*) [16])((long)*ptr_01 + lVar27) = auVar70;
                  lVar27 = lVar27 + 0x10;
                  iVar64 = lVar13;
                  lVar35 = lVar14;
                } while (uVar28 << 4 != lVar27);
                auVar52._0_8_ = auVar70._0_8_;
                auVar52._8_4_ = auVar70._0_4_;
                auVar52._12_4_ = auVar70._4_4_;
                uVar1 = uVar34 + 1;
                lVar35 = ptr_00[uVar34 + 1];
                lVar27 = (*ptr_03)[0] + lVar35;
                if (lVar27 < auVar71._0_8_) {
                  lVar27 = auVar71._0_8_;
                }
                auVar53._8_8_ = auVar52._8_8_;
                auVar53._0_8_ = lVar35;
                auVar61._8_8_ = lVar27;
                auVar61._0_8_ = local_d0;
                auVar41._0_8_ = -(ulong)((long)local_d0 < lVar35);
                auVar41._8_8_ = -(ulong)(lVar27 < auVar53._8_8_);
                auVar74 = blendvpd(auVar61,auVar53,auVar41);
                lVar27 = 0;
                do {
                  auVar72._0_8_ = auVar61._0_8_ - (ulong)(uint)gap;
                  auVar72._8_8_ = auVar61._8_8_ - (ulong)(uint)gap;
                  auVar67._0_8_ = auVar74._0_8_ - (ulong)(uint)open;
                  auVar67._8_8_ = auVar74._8_8_ - (ulong)(uint)open;
                  auVar42._0_8_ = -(ulong)(auVar67._0_8_ < auVar72._0_8_);
                  auVar42._8_8_ = -(ulong)(auVar67._8_8_ < auVar72._8_8_);
                  auVar61 = blendvpd(auVar67,auVar72,auVar42);
                  auVar74 = *(undefined1 (*) [16])((long)*ptr_01 + lVar27);
                  auVar43._0_8_ = -(ulong)(auVar61._0_8_ < auVar74._0_8_);
                  auVar43._8_8_ = -(ulong)(auVar61._8_8_ < auVar74._8_8_);
                  auVar74 = blendvpd(auVar61,auVar74,auVar43);
                  auVar44._0_8_ = -(ulong)(auVar55._0_8_ < auVar74._0_8_);
                  auVar44._8_8_ = -(ulong)(auVar55._8_8_ < auVar74._8_8_);
                  auVar55 = blendvpd(auVar74,auVar55,auVar44);
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar27) = auVar74;
                  auVar45._0_8_ = -(ulong)(auVar55._0_8_ < auVar61._0_8_);
                  auVar45._8_8_ = -(ulong)(auVar55._8_8_ < auVar61._8_8_);
                  auVar55 = blendvpd(auVar61,auVar55,auVar45);
                  auVar46._0_8_ = -(ulong)(auVar74._0_8_ < auVar62._0_8_);
                  auVar46._8_8_ = -(ulong)(auVar74._8_8_ < auVar62._8_8_);
                  auVar62 = blendvpd(auVar74,auVar62,auVar46);
                  lVar27 = lVar27 + 0x10;
                } while (uVar28 << 4 != lVar27);
                alVar60 = ptr_02[uVar8];
                uVar51 = alVar60[1];
                auVar47._0_8_ = -(ulong)(auVar59._0_8_ < alVar60[0]);
                auVar47._8_8_ = -(ulong)(auVar59._8_8_ < (long)uVar51);
                auVar10._8_4_ = (int)-(ulong)(uVar19 == 1);
                auVar10._0_8_ = -(ulong)(uVar19 == 0);
                auVar10._12_4_ = (int)(-(ulong)(uVar19 == 1) >> 0x20);
                iVar22 = movmskpd((int)lVar35,auVar10 & auVar47);
                if (iVar22 != 0) {
                  iVar25 = (int)uVar34;
                }
                auVar59 = blendvpd(auVar59,(undefined1  [16])alVar60,auVar47);
                if ((int)uVar19 < 1) {
                  do {
                    uVar51 = alVar60[0];
                    auVar15._8_8_ = 0;
                    auVar15._0_8_ = uVar51;
                    alVar60 = (__m128i)(auVar15 << 0x40);
                  } while ((int)uVar19 < 0);
                }
                ((ppVar20->field_4).rowcols)->score_row[uVar34] = (int)uVar51;
                uVar34 = uVar1;
              } while (uVar1 != (uint)s2Len);
              lVar35 = 0;
              do {
                puVar3 = (undefined4 *)((long)*ptr_02 + lVar35 * 4);
                uVar57 = puVar3[2];
                piVar7 = ((ppVar20->field_4).rowcols)->score_col;
                *(undefined4 *)((long)piVar7 + lVar35) = *puVar3;
                *(undefined4 *)((long)piVar7 + uVar28 * 4 + lVar35) = uVar57;
                lVar35 = lVar35 + 4;
              } while (uVar28 * 4 != lVar35);
              if ((s2_end != 0) && (local_d0 = auVar59._8_8_, (int)uVar19 < 1)) {
                do {
                  local_d0 = auVar59._0_8_;
                  auVar12._8_8_ = 0;
                  auVar12._0_8_ = local_d0;
                  auVar59 = auVar12 << 0x40;
                } while ((int)uVar19 < 0);
              }
              uVar26 = uVar19;
              uVar32 = uVar18;
              if ((s1_end != 0) && ((uVar33 & 0x7ffffffe) != 0)) {
                uVar33 = 0;
                do {
                  uVar26 = 0;
                  if ((uVar33 & 1) != 0) {
                    uVar26 = uVar11;
                  }
                  uVar26 = uVar26 + ((uint)(uVar33 >> 1) & 0x7fffffff);
                  iVar22 = iVar25;
                  uVar17 = uVar32;
                  uVar28 = local_d0;
                  if (((int)uVar26 < (int)uVar4) &&
                     (uVar34 = (*ptr_02)[uVar33], iVar22 = iVar23, uVar17 = uVar26, uVar28 = uVar34,
                     (long)uVar34 <= (long)local_d0)) {
                    if ((int)uVar32 <= (int)uVar26) {
                      uVar26 = uVar32;
                    }
                    if (iVar25 != iVar23) {
                      uVar26 = uVar32;
                    }
                    iVar22 = iVar25;
                    uVar17 = uVar32;
                    uVar28 = local_d0;
                    if (uVar34 == local_d0) {
                      uVar17 = uVar26;
                    }
                  }
                  local_d0 = uVar28;
                  uVar32 = uVar17;
                  iVar25 = iVar22;
                  uVar33 = uVar33 + 1;
                } while ((uVar11 & 0x3fffffff) * 2 != (int)uVar33);
              }
              iVar22 = (int)local_d0;
              if (s2_end == 0 && s1_end == 0) {
                lVar36 = ptr_02[uVar8][0];
                iVar22 = (int)ptr_02[uVar8][1];
                iVar25 = iVar23;
                uVar26 = uVar19;
                uVar32 = uVar18;
                if ((int)uVar19 < 1) {
                  do {
                    iVar22 = (int)lVar36;
                    lVar36 = 0;
                  } while ((int)uVar19 < 0);
                }
              }
              auVar48._8_4_ = (int)uVar30;
              auVar48._0_8_ = uVar30;
              auVar48._12_4_ = (int)(uVar30 >> 0x20);
              auVar56._0_8_ = -(ulong)((long)uVar30 < auVar55._0_8_);
              auVar56._8_8_ = -(ulong)(auVar48._8_8_ < auVar55._8_8_);
              auVar49._8_4_ = 0xffffffff;
              auVar49._0_8_ = 0xffffffffffffffff;
              auVar49._12_4_ = 0xffffffff;
              auVar54._8_4_ = (int)local_48;
              auVar54._0_8_ = local_48;
              auVar54._12_4_ = uVar50;
              auVar63._0_8_ = -(ulong)(local_48 < auVar62._0_8_);
              auVar63._8_8_ = -(ulong)(auVar54._8_8_ < auVar62._8_8_);
              iVar23 = movmskpd(uVar26,auVar63 | auVar49 ^ auVar56);
              if (iVar23 != 0) {
                *(byte *)&ppVar20->flag = (byte)ppVar20->flag | 0x40;
                iVar22 = 0;
                iVar25 = 0;
                uVar32 = 0;
              }
              ppVar20->score = iVar22;
              ppVar20->end_query = uVar32;
              ppVar20->end_ref = iVar25;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar20;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vE, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vHp = _mm_add_epi64(vHp, vW);
            vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[i]));
            vHt = _mm_max_epi64_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            vF = _mm_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        vH = _mm_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vF, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vH = _mm_max_epi64_rpl(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}